

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O3

int cpio_getopt(cpio *cpio)

{
  char cVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  char **ppcVar7;
  option *poVar8;
  option *poVar9;
  uint __c;
  char *__s2;
  size_t __n;
  char *pcVar10;
  option *poVar11;
  option *local_48;
  
  do {
    pcVar10 = cpio_getopt::opt_word;
    iVar2 = cpio_getopt::state;
    cpio->argument = (char *)0x0;
    pcVar4 = pcVar10;
    switch(iVar2) {
    case 0:
      ppcVar7 = cpio->argv + 1;
      cpio->argv = ppcVar7;
      cpio->argc = cpio->argc + -1;
      cpio_getopt::state = 1;
      break;
    case 1:
      ppcVar7 = cpio->argv;
      break;
    case 2:
      goto switchD_0010485a_caseD_2;
    case 3:
      goto switchD_0010485a_caseD_3;
    default:
      goto switchD_0010485a_default;
    }
    pcVar4 = *ppcVar7;
    if (pcVar4 == (char *)0x0) {
      return -1;
    }
    if (*pcVar4 != '-') {
      return -1;
    }
    if ((pcVar4[1] == '-') && (pcVar4[2] == '\0')) {
      cpio->argv = ppcVar7 + 1;
      cpio->argc = cpio->argc + -1;
      return -1;
    }
    cpio->argv = ppcVar7 + 1;
    pcVar4 = *ppcVar7;
    cpio->argc = cpio->argc + -1;
    if (pcVar4[1] == '-') {
      pcVar10 = pcVar4 + 2;
      cpio_getopt::opt_word = pcVar10;
      break;
    }
    pcVar4 = pcVar4 + 1;
    cpio_getopt::state = 2;
switchD_0010485a_caseD_2:
    pcVar10 = pcVar4 + 1;
    cVar1 = *pcVar4;
    __c = (uint)cVar1;
    cpio_getopt::opt_word = pcVar10;
    if (cVar1 != '\0') {
      pvVar3 = memchr("0AaBC:cdE:F:f:H:hI:iJjLlmnO:opR:rtuVvW:yZz",__c,0x2b);
      if (pvVar3 == (void *)0x0) {
        return 0x3f;
      }
      if (*(char *)((long)pvVar3 + 1) != ':') {
        return __c;
      }
      if (*pcVar10 == '\0') {
        pcVar10 = *cpio->argv;
        cpio_getopt::opt_word = pcVar10;
        if (pcVar10 == (char *)0x0) {
          lafe_warnc(0,"Option -%c requires an argument",(ulong)__c);
          return 0x3f;
        }
        cpio->argv = cpio->argv + 1;
        cpio->argc = cpio->argc + -1;
      }
      if (cVar1 != 'W') {
        cpio_getopt::state = 1;
        cpio->argument = pcVar10;
        return __c;
      }
      pcVar4 = "-W ";
      goto LAB_00104981;
    }
    cpio_getopt::state = 1;
  } while( true );
switchD_0010485a_caseD_3:
  pcVar4 = "--";
LAB_00104981:
  cpio_getopt::state = 1;
  pcVar5 = strchr(pcVar10,0x3d);
  if (pcVar5 == (char *)0x0) {
    __n = strlen(pcVar10);
  }
  else {
    __n = (long)pcVar5 - (long)pcVar10;
    cpio->argument = pcVar5 + 1;
  }
  cVar1 = *pcVar10;
  poVar11 = cpio_longopts;
  __s2 = "b64encode";
  local_48 = (option *)0x0;
  poVar8 = (option *)0x0;
  do {
    poVar9 = poVar8;
    if (((*__s2 == cVar1) && (iVar2 = strncmp(pcVar10,__s2,__n), iVar2 == 0)) &&
       (sVar6 = strlen(__s2), poVar9 = poVar11, local_48 = poVar8, sVar6 == __n)) goto LAB_00104a85;
    __s2 = poVar11[1].name;
    poVar11 = poVar11 + 1;
    poVar8 = poVar9;
  } while (__s2 != (char *)0x0);
  if (poVar9 != (option *)0x0) {
    if (local_48 != (option *)0x0) {
      lafe_warnc(0,"Ambiguous option %s%s (matches --%s and --%s)",pcVar4,pcVar10,poVar9->name,
                 local_48->name);
      return 0x3f;
    }
LAB_00104a85:
    if (poVar9->required == 0) {
      if (pcVar5 != (char *)0x0) {
        pcVar10 = poVar9->name;
        pcVar5 = "Option %s%s does not allow an argument";
        goto LAB_00104b0b;
      }
    }
    else if (pcVar5 == (char *)0x0) {
      pcVar10 = *cpio->argv;
      cpio->argument = pcVar10;
      if (pcVar10 == (char *)0x0) {
        pcVar10 = poVar9->name;
        pcVar5 = "Option %s%s requires an argument";
        goto LAB_00104b0b;
      }
      cpio->argv = cpio->argv + 1;
      cpio->argc = cpio->argc + -1;
    }
    return poVar9->equivalent;
  }
  pcVar5 = "Option %s%s is not supported";
LAB_00104b0b:
  lafe_warnc(0,pcVar5,pcVar4,pcVar10);
switchD_0010485a_default:
  return 0x3f;
}

Assistant:

int
cpio_getopt(struct cpio *cpio)
{
	enum { state_start = 0, state_next_word, state_short, state_long };
	static int state = state_start;
	static char *opt_word;

	const struct option *popt, *match = NULL, *match2 = NULL;
	const char *p, *long_prefix = "--";
	size_t optlength;
	int opt = '?';
	int required = 0;

	cpio->argument = NULL;

	/* First time through, initialize everything. */
	if (state == state_start) {
		/* Skip program name. */
		++cpio->argv;
		--cpio->argc;
		state = state_next_word;
	}

	/*
	 * We're ready to look at the next word in argv.
	 */
	if (state == state_next_word) {
		/* No more arguments, so no more options. */
		if (cpio->argv[0] == NULL)
			return (-1);
		/* Doesn't start with '-', so no more options. */
		if (cpio->argv[0][0] != '-')
			return (-1);
		/* "--" marks end of options; consume it and return. */
		if (strcmp(cpio->argv[0], "--") == 0) {
			++cpio->argv;
			--cpio->argc;
			return (-1);
		}
		/* Get next word for parsing. */
		opt_word = *cpio->argv++;
		--cpio->argc;
		if (opt_word[1] == '-') {
			/* Set up long option parser. */
			state = state_long;
			opt_word += 2; /* Skip leading '--' */
		} else {
			/* Set up short option parser. */
			state = state_short;
			++opt_word;  /* Skip leading '-' */
		}
	}

	/*
	 * We're parsing a group of POSIX-style single-character options.
	 */
	if (state == state_short) {
		/* Peel next option off of a group of short options. */
		opt = *opt_word++;
		if (opt == '\0') {
			/* End of this group; recurse to get next option. */
			state = state_next_word;
			return cpio_getopt(cpio);
		}

		/* Does this option take an argument? */
		p = strchr(short_options, opt);
		if (p == NULL)
			return ('?');
		if (p[1] == ':')
			required = 1;

		/* If it takes an argument, parse that. */
		if (required) {
			/* If arg is run-in, opt_word already points to it. */
			if (opt_word[0] == '\0') {
				/* Otherwise, pick up the next word. */
				opt_word = *cpio->argv;
				if (opt_word == NULL) {
					lafe_warnc(0,
					    "Option -%c requires an argument",
					    opt);
					return ('?');
				}
				++cpio->argv;
				--cpio->argc;
			}
			if (opt == 'W') {
				state = state_long;
				long_prefix = "-W "; /* For clearer errors. */
			} else {
				state = state_next_word;
				cpio->argument = opt_word;
			}
		}
	}

	/* We're reading a long option, including -W long=arg convention. */
	if (state == state_long) {
		/* After this long option, we'll be starting a new word. */
		state = state_next_word;

		/* Option name ends at '=' if there is one. */
		p = strchr(opt_word, '=');
		if (p != NULL) {
			optlength = (size_t)(p - opt_word);
			cpio->argument = (char *)(uintptr_t)(p + 1);
		} else {
			optlength = strlen(opt_word);
		}

		/* Search the table for an unambiguous match. */
		for (popt = cpio_longopts; popt->name != NULL; popt++) {
			/* Short-circuit if first chars don't match. */
			if (popt->name[0] != opt_word[0])
				continue;
			/* If option is a prefix of name in table, record it.*/
			if (strncmp(opt_word, popt->name, optlength) == 0) {
				match2 = match; /* Record up to two matches. */
				match = popt;
				/* If it's an exact match, we're done. */
				if (strlen(popt->name) == optlength) {
					match2 = NULL; /* Forget the others. */
					break;
				}
			}
		}

		/* Fail if there wasn't a unique match. */
		if (match == NULL) {
			lafe_warnc(0,
			    "Option %s%s is not supported",
			    long_prefix, opt_word);
			return ('?');
		}
		if (match2 != NULL) {
			lafe_warnc(0,
			    "Ambiguous option %s%s (matches --%s and --%s)",
			    long_prefix, opt_word, match->name, match2->name);
			return ('?');
		}

		/* We've found a unique match; does it need an argument? */
		if (match->required) {
			/* Argument required: get next word if necessary. */
			if (cpio->argument == NULL) {
				cpio->argument = *cpio->argv;
				if (cpio->argument == NULL) {
					lafe_warnc(0,
					    "Option %s%s requires an argument",
					    long_prefix, match->name);
					return ('?');
				}
				++cpio->argv;
				--cpio->argc;
			}
		} else {
			/* Argument forbidden: fail if there is one. */
			if (cpio->argument != NULL) {
				lafe_warnc(0,
				    "Option %s%s does not allow an argument",
				    long_prefix, match->name);
				return ('?');
			}
		}
		return (match->equivalent);
	}

	return (opt);
}